

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlendMode.cpp
# Opt level: O3

void __thiscall
sf::BlendMode::BlendMode
          (BlendMode *this,Factor colorSourceFactor,Factor colorDestinationFactor,
          Equation colorBlendEquation,Factor alphaSourceFactor,Factor alphaDestinationFactor,
          Equation alphaBlendEquation)

{
  this->colorSrcFactor = colorSourceFactor;
  this->colorDstFactor = colorDestinationFactor;
  this->colorEquation = colorBlendEquation;
  this->alphaSrcFactor = alphaSourceFactor;
  this->alphaDstFactor = alphaDestinationFactor;
  this->alphaEquation = alphaBlendEquation;
  return;
}

Assistant:

BlendMode::BlendMode(Factor colorSourceFactor, Factor colorDestinationFactor,
                     Equation colorBlendEquation, Factor alphaSourceFactor,
                     Factor alphaDestinationFactor, Equation alphaBlendEquation) :
colorSrcFactor(colorSourceFactor),
colorDstFactor(colorDestinationFactor),
colorEquation (colorBlendEquation),
alphaSrcFactor(alphaSourceFactor),
alphaDstFactor(alphaDestinationFactor),
alphaEquation (alphaBlendEquation)
{

}